

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_leader.cpp
# Opt level: O0

bool __thiscall ON_Leader::Transform(ON_Leader *this,ON_Xform *xform)

{
  double s;
  ON_3dPoint p;
  bool bVar1;
  uint uVar2;
  ON_2dPoint *pOVar3;
  ON_3dPoint *pOVar4;
  ON_2dPoint *pOVar5;
  int local_68;
  int i_1;
  ON_3dPoint local_58;
  int local_3c;
  undefined1 local_38 [4];
  int i;
  ON_3dPointArray pts;
  int cnt;
  bool rc;
  ON_Xform *xform_local;
  ON_Leader *this_local;
  
  pts.super_ON_SimpleArray<ON_3dPoint>.m_capacity._3_1_ =
       ON_Geometry::Transform((ON_Geometry *)this,xform);
  if ((bool)pts.super_ON_SimpleArray<ON_3dPoint>.m_capacity._3_1_) {
    bVar1 = ON_Xform::IsTranslation(xform,0.0);
    if (bVar1) {
      pts.super_ON_SimpleArray<ON_3dPoint>.m_capacity._3_1_ =
           ON_Plane::Transform(&(this->super_ON_Annotation).m_plane,xform);
    }
    else {
      pts.super_ON_SimpleArray<ON_3dPoint>.m_count =
           ON_SimpleArray<ON_2dPoint>::Count(&(this->m_points).super_ON_SimpleArray<ON_2dPoint>);
      ON_3dPointArray::ON_3dPointArray
                ((ON_3dPointArray *)local_38,pts.super_ON_SimpleArray<ON_3dPoint>.m_count + 1);
      for (local_3c = 0; local_3c < pts.super_ON_SimpleArray<ON_3dPoint>.m_count;
          local_3c = local_3c + 1) {
        pOVar3 = ON_SimpleArray<ON_2dPoint>::operator[]
                           (&(this->m_points).super_ON_SimpleArray<ON_2dPoint>,local_3c);
        s = pOVar3->x;
        pOVar3 = ON_SimpleArray<ON_2dPoint>::operator[]
                           (&(this->m_points).super_ON_SimpleArray<ON_2dPoint>,local_3c);
        ON_Plane::PointAt(&local_58,&(this->super_ON_Annotation).m_plane,s,pOVar3->y);
        pOVar4 = ON_SimpleArray<ON_3dPoint>::AppendNew((ON_SimpleArray<ON_3dPoint> *)local_38);
        pOVar4->z = local_58.z;
        pOVar4->x = local_58.x;
        pOVar4->y = local_58.y;
        pOVar4 = ON_SimpleArray<ON_3dPoint>::operator[]
                           ((ON_SimpleArray<ON_3dPoint> *)local_38,local_3c);
        ON_3dPoint::Transform(pOVar4,xform);
      }
      ON_2dPoint::operator=(&this->m_text_point,&ON_3dPoint::UnsetPoint);
      pts.super_ON_SimpleArray<ON_3dPoint>.m_capacity._3_1_ =
           ON_Plane::Transform(&(this->super_ON_Annotation).m_plane,xform);
      for (local_68 = 0; local_68 < pts.super_ON_SimpleArray<ON_3dPoint>.m_count;
          local_68 = local_68 + 1) {
        pOVar4 = ON_SimpleArray<ON_3dPoint>::operator[]
                           ((ON_SimpleArray<ON_3dPoint> *)local_38,local_68);
        p = *pOVar4;
        pOVar3 = ON_SimpleArray<ON_2dPoint>::operator[]
                           (&(this->m_points).super_ON_SimpleArray<ON_2dPoint>,local_68);
        pOVar5 = ON_SimpleArray<ON_2dPoint>::operator[]
                           (&(this->m_points).super_ON_SimpleArray<ON_2dPoint>,local_68);
        ON_Plane::ClosestPointTo(&(this->super_ON_Annotation).m_plane,p,&pOVar3->x,&pOVar5->y);
      }
      ON_3dPointArray::~ON_3dPointArray((ON_3dPointArray *)local_38);
    }
  }
  if ((((pts.super_ON_SimpleArray<ON_3dPoint>.m_capacity._3_1_ & 1) != 0) &&
      (this->m_curve != (ON_NurbsCurve *)0x0)) &&
     (uVar2 = (*(this->m_curve->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                [0x1c])(this->m_curve,xform), (uVar2 & 1) == 0)) {
    if (this->m_curve != (ON_NurbsCurve *)0x0) {
      (*(this->m_curve->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])();
    }
    this->m_curve = (ON_NurbsCurve *)0x0;
  }
  return (bool)(pts.super_ON_SimpleArray<ON_3dPoint>.m_capacity._3_1_ & 1);
}

Assistant:

bool ON_Leader::Transform(const ON_Xform& xform)
{
  bool rc = ON_Geometry::Transform(xform);
  if (rc)
  {
    if (xform.IsTranslation())
      rc = m_plane.Transform(xform);
    else
    {
      int cnt = m_points.Count();
      ON_3dPointArray pts(cnt+1);
      for (int i = 0; i < cnt; i++)
      {
        pts.AppendNew() = m_plane.PointAt(m_points[i].x, m_points[i].y);
        pts[i].Transform(xform);
      }
      m_text_point = ON_3dPoint::UnsetPoint;
      rc = m_plane.Transform(xform);
      for (int i = 0; i < cnt; i++)
        m_plane.ClosestPointTo(pts[i], &m_points[i].x, &m_points[i].y);
    }
  }
  if (rc && nullptr != m_curve && !m_curve->Transform(xform))
  {
    delete m_curve;
    m_curve = nullptr;
  }
  return rc;
}